

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

Socket * sk_net_accept(accept_ctx_t ctx,Plug *plug)

{
  NetSocket *s;
  int *piVar1;
  char *pcVar2;
  NetSocket *ret;
  int sockfd;
  Plug *plug_local;
  accept_ctx_t ctx_local;
  
  plug_local._0_4_ = ctx.i;
  s = (NetSocket *)safemalloc(1,0x98,0);
  (s->sock).vt = &NetSocket_sockvt;
  s->error = (char *)0x0;
  s->plug = plug;
  bufchain_init(&s->output_data);
  s->writable = true;
  s->sending_oob = 0;
  s->frozen = true;
  s->localhost_only = false;
  s->pending_error = 0;
  s->oobpending = false;
  s->outgoingeof = EOF_NO;
  s->incomingeof = false;
  s->listener = false;
  s->child = (NetSocket *)0x0;
  s->parent = (NetSocket *)0x0;
  s->addr = (SockAddr *)0x0;
  s->connected = true;
  s->s = (int)plug_local;
  if (s->s < 0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    s->error = pcVar2;
  }
  else {
    s->oobinline = false;
    uxsel_tell(s);
    add234(sktree,s);
  }
  ctx_local.p = &s->sock;
  return (Socket *)ctx_local.p;
}

Assistant:

static Socket *sk_net_accept(accept_ctx_t ctx, Plug *plug)
{
    int sockfd = ctx.i;
    NetSocket *ret;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = true;              /* to start with */
    ret->sending_oob = 0;
    ret->frozen = true;
    ret->localhost_only = false;    /* unused, but best init anyway */
    ret->pending_error = 0;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = false;
    ret->parent = ret->child = NULL;
    ret->addr = NULL;
    ret->connected = true;

    ret->s = sockfd;

    if (ret->s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    ret->oobinline = false;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}